

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_ecb.c
# Opt level: O2

void beltECBStepE(void *buf,size_t count,void *state)

{
  for (; 0xf < count; count = count - 0x10) {
    beltBlockEncr((octet *)buf,(u32 *)state);
    buf = (void *)((long)buf + 0x10);
  }
  if (count != 0) {
    memSwap((octet *)((long)buf + -0x10),buf,count);
    beltBlockEncr((octet *)((long)buf + -0x10),(u32 *)state);
    return;
  }
  return;
}

Assistant:

void beltECBStepE(void* buf, size_t count, void* state)
{
	belt_ecb_st* st = (belt_ecb_st*)state;
	ASSERT(count >= 16);
	ASSERT(memIsDisjoint2(buf, count, state, beltECB_keep()));
	// цикл по полным блокам
	while(count >= 16)
	{
		beltBlockEncr(buf, st->key);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок? кража блока
	if (count)
	{
		memSwap((octet*)buf - 16, buf, count);
		beltBlockEncr((octet*)buf - 16, st->key);
	}
}